

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void unstuff59bits(uint thumbT_word1,uint thumbT_word2,uint *thumbT59_word1,uint *thumbT59_word2)

{
  uint8 R0a;
  uint *thumbT59_word2_local;
  uint *thumbT59_word1_local;
  uint thumbT_word2_local;
  uint thumbT_word1_local;
  
  *thumbT59_word1 = thumbT_word1 >> 1;
  *thumbT59_word1 = *thumbT59_word1 & 0xfffffffe | thumbT_word1 & 1;
  *thumbT59_word1 = *thumbT59_word1 & 0xf9ffffff | (uint)((byte)(thumbT_word1 >> 0x1b) & 3) << 0x19;
  *thumbT59_word1 = *thumbT59_word1 & 0x7ffffff;
  *thumbT59_word2 = thumbT_word2;
  return;
}

Assistant:

void unstuff59bits(unsigned int thumbT_word1, unsigned int thumbT_word2, unsigned int &thumbT59_word1, unsigned int &thumbT59_word2)
{
	// Get bits from twotimer configuration 59 bits. 
	// 
	// Go to this bit layout:
	//
	//     |63 62 61 60 59|58 57 56 55|54 53 52 51|50 49 48 47|46 45 44 43|42 41 40 39|38 37 36 35|34 33 32|
	//     |----empty-----|---red 0---|--green 0--|--blue 0---|---red 1---|--green 1--|--blue 1---|--dist--|
	//
	//     |31 30 29 28 27 26 25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10 09 08 07 06 05 04 03 02 01 00|
	//     |----------------------------------------index bits---------------------------------------------|
	//
	//
	//  From this:
	// 
	//      63 62 61 60 59 58 57 56 55 54 53 52 51 50 49 48 47 46 45 44 43 42 41 40 39 38 37 36 35 34 33 32 
	//      -----------------------------------------------------------------------------------------------
	//     |// // //|R0a  |//|R0b  |G0         |B0         |R1         |G1         |B1          |da  |df|db|
	//      -----------------------------------------------------------------------------------------------
	//
	//     |31 30 29 28 27 26 25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10 09 08 07 06 05 04 03 02 01 00|
	//     |----------------------------------------index bits---------------------------------------------|
	//
	//      63 62 61 60 59 58 57 56 55 54 53 52 51 50 49 48 47 46 45 44 43 42 41 40 39 38 37 36 35 34 33 32 
	//      -----------------------------------------------------------------------------------------------
	//     | base col1    | dcol 2 | base col1    | dcol 2 | base col 1   | dcol 2 | table  | table  |df|fp|
	//     | R1' (5 bits) | dR2    | G1' (5 bits) | dG2    | B1' (5 bits) | dB2    | cw 1   | cw 2   |bt|bt|
	//      ------------------------------------------------------------------------------------------------

	uint8 R0a;

	// Fix middle part
	thumbT59_word1 = thumbT_word1 >> 1;
	// Fix db (lowest bit of d)
	PUTBITSHIGH( thumbT59_word1, thumbT_word1,  1, 32);
	// Fix R0a (top two bits of R0)
	R0a = GETBITSHIGH( thumbT_word1, 2, 60);
	PUTBITSHIGH( thumbT59_word1, R0a,  2, 58);

	// Zero top part (not needed)
	PUTBITSHIGH( thumbT59_word1, 0,  5, 63);

	thumbT59_word2 = thumbT_word2;
}